

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  int iVar1;
  ImDrawChannel *pIVar2;
  int in_EDX;
  int *in_RDI;
  ImDrawCmd draw_cmd;
  int i;
  int old_channels_count;
  ImDrawCmd *in_stack_ffffffffffffff78;
  int i_00;
  ImDrawCmd *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  char cVar3;
  int local_1c;
  
  cVar3 = '\0';
  if ((*in_RDI == 0) && (cVar3 = '\0', in_RDI[1] < 2)) {
    cVar3 = '\x01';
  }
  if (cVar3 == '\0') {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x528,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar1 = in_RDI[2];
  if (iVar1 < in_EDX) {
    ImVector<ImDrawChannel>::resize
              ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  }
  in_RDI[1] = in_EDX;
  pIVar2 = ImVector<ImDrawChannel>::operator[]
                     ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,
                      (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  memset(pIVar2,0,0x20);
  for (local_1c = 1; local_1c < in_EDX; local_1c = local_1c + 1) {
    i_00 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (local_1c < iVar1) {
      ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,i_00)
      ;
      ImVector<ImDrawCmd>::resize
                ((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80,
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      ImVector<ImDrawChannel>::operator[]
                ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      ImVector<unsigned_int>::resize
                ((ImVector<unsigned_int> *)in_stack_ffffffffffffff80,
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    }
    else {
      in_stack_ffffffffffffff78 =
           (ImDrawCmd *)
           ImVector<ImDrawChannel>::operator[]
                     ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,i_00);
      in_stack_ffffffffffffff80 = (ImDrawCmd *)operator_new(0x20);
      *(undefined8 *)&(in_stack_ffffffffffffff80->ClipRect).w = 0;
      in_stack_ffffffffffffff80->TextureId = (ImTextureID)0x0;
      in_stack_ffffffffffffff80->ElemCount = 0;
      (in_stack_ffffffffffffff80->ClipRect).x = 0.0;
      *(ImDrawCmd **)&(in_stack_ffffffffffffff80->ClipRect).y = (ImDrawCmd *)0x0;
      ImDrawChannel::ImDrawChannel((ImDrawChannel *)CONCAT17(cVar3,in_stack_ffffffffffffff90));
    }
    pIVar2 = ImVector<ImDrawChannel>::operator[]
                       ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,
                        (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    if ((pIVar2->_CmdBuffer).Size == 0) {
      ImDrawCmd::ImDrawCmd(in_stack_ffffffffffffff80);
      ImVector<ImVec4>::back((ImVector<ImVec4> *)in_stack_ffffffffffffff80);
      ImVector<void_*>::back((ImVector<void_*> *)in_stack_ffffffffffffff80);
      ImVector<ImDrawChannel>::operator[]
                ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      ImVector<ImDrawCmd>::push_back
                ((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}